

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O2

API<Args::CmdLine,_Args::AllOfGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
::addAllOfGroup<char_const(&)[2]>
          (API<Args::CmdLine,_Args::AllOfGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
           *__return_storage_ptr__,
          API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
          *this,char (*name) [2],bool required)

{
  ArgIface *this_00;
  ArgPtr local_38;
  
  this_00 = (ArgIface *)operator_new(0x50);
  AllOfGroup::AllOfGroup<char_const(&)[2]>((AllOfGroup *)this_00,name,required);
  local_38._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
  super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
  super__Tuple_impl<1UL,_Args::details::Deleter<Args::ArgIface>_>.
  super__Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>._M_head_impl.m_delete =
       (_Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>)(Deleter<Args::ArgIface>)0x1;
  local_38._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
  super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
  super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl = this_00;
  CmdLine::addArg(*(CmdLine **)(this + 0x10),&local_38);
  if ((local_38._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>.
       _M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
       super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl != (ArgIface *)0x0) &&
     (local_38._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>.
      _M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
      super__Tuple_impl<1UL,_Args::details::Deleter<Args::ArgIface>_>.
      super__Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>._M_head_impl.m_delete ==
      (Deleter<Args::ArgIface>)0x1)) {
    (*(((GroupIface *)
       &(local_38._M_t.
         super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
         super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
         super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface)->
      super_ArgIface)._vptr_ArgIface[1])();
  }
  __return_storage_ptr__->_vptr_API = (_func_int **)&PTR__API_0015e9c0;
  __return_storage_ptr__->m_parent = (CmdLine *)this;
  __return_storage_ptr__->m_self = (AllOfGroup *)this_00;
  return __return_storage_ptr__;
}

Assistant:

API< PARENT, AllOfGroup, ARGPTR, false > addAllOfGroup(
		//! Name of the group.
		NAME && name,
		//! Is group required?
		bool required = false )
	{
		auto group = std::unique_ptr< AllOfGroup, details::Deleter< ArgIface > > (
			new AllOfGroup( std::forward< NAME > ( name ), required ),
			details::Deleter< ArgIface > ( true ) );

		AllOfGroup & g = *group;

		ARGPTR a = std::move( group );

		m_self.addArg( std::move( a ) );

		return API< PARENT, AllOfGroup, ARGPTR, false >
			( *( static_cast< PARENT* > ( this ) ), g );
	}